

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O1

void __thiscall
helics::Publication::Publication
          (Publication *this,ValueFederate *valueFed,InterfaceHandle id,string_view key,
          string_view type,string_view units)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  string_view typeName;
  DataType DVar4;
  uint64_t match_flags;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  Federate *federate;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var6;
  char *in_stack_ffffffffffffffa8;
  string local_48;
  
  if (valueFed == (ValueFederate *)0x0) {
    federate = (Federate *)0x0;
  }
  else {
    federate = (Federate *)
               ((long)&valueFed->_vptr_ValueFederate + (long)valueFed->_vptr_ValueFederate[-3]);
  }
  Interface::Interface(&this->super_Interface,federate,id,key);
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Publication_004cafa0;
  this->fed = valueFed;
  this->referenceIndex = -1;
  this->dataReference = (void *)0x0;
  this->delta = -1.0;
  this->pubType = HELICS_ANY;
  this->changeDetectionEnabled = false;
  this->disableAssign = false;
  *(__index_type *)
   ((long)&(this->prevValue).
           super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
           .
           super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
           .
           super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
           .
           super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
           .
           super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
           .
           super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
   + 0x28) = '\0';
  this->customTypeHash = 0;
  *(undefined8 *)
   &(this->prevValue).
    super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
    .
    super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    ._M_u = 0;
  (this->pubUnits)._M_dataplus._M_p = (pointer)&(this->pubUnits).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->pubUnits,units._M_str,units._M_str + units._M_len);
  (this->pubUnitType).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->pubUnitType).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  typeName._M_str = in_stack_ffffffffffffffa8;
  typeName._M_len = 0x208108;
  DVar4 = getTypeFromString(typeName);
  this->pubType = DVar4;
  if (units._M_len != 0) {
    pcVar1 = (this->pubUnits)._M_dataplus._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + (this->pubUnits)._M_string_length);
    match_flags = ::units::getDefaultFlags();
    _Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
            ::units::unit_from_string(&local_48,match_flags);
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    p_Var5->_M_use_count = 1;
    p_Var5->_M_weak_count = 1;
    p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_004cb2b0;
    p_Var5[1] = _Var6;
    (this->pubUnitType).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var5 + 1);
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (this->pubUnitType).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (this->pubUnitType).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var5;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    peVar3 = (this->pubUnitType).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if ((NAN(peVar3->multiplier_)) && (peVar3->base_units_ == (unit_data)0xfa94a488)) {
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (this->pubUnitType).
               super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      (this->pubUnitType).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      (this->pubUnitType).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
    }
  }
  return;
}

Assistant:

Publication::Publication(ValueFederate* valueFed,
                         InterfaceHandle id,
                         std::string_view key,
                         std::string_view type,
                         std::string_view units):
    Interface(valueFed, id, key), fed(valueFed), pubUnits(units)
{
    pubType = getTypeFromString(type);
    if (!units.empty()) {
        pubUnitType = std::make_shared<units::precise_unit>(units::unit_from_string(pubUnits));
        if (!units::is_valid(*pubUnitType)) {
            pubUnitType.reset();
        }
    }
}